

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utGenNormals.cpp
# Opt level: O0

void __thiscall GenNormalsTest::SetUp(GenNormalsTest *this)

{
  GenVertexNormalsProcess *this_00;
  aiMesh *this_01;
  undefined8 *puVar1;
  uint *puVar2;
  aiVector3D *paVar3;
  aiVector3t<float> *local_80;
  aiFace *local_58;
  aiVector3t<float> local_40;
  aiVector3t<float> local_34;
  aiVector3t<float> local_28 [2];
  GenNormalsTest *local_10;
  GenNormalsTest *this_local;
  
  local_10 = this;
  this_00 = (GenVertexNormalsProcess *)operator_new(0x20);
  Assimp::GenVertexNormalsProcess::GenVertexNormalsProcess(this_00);
  this->piProcess = this_00;
  this_01 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_01);
  this->pcMesh = this_01;
  this->pcMesh->mPrimitiveTypes = 4;
  this->pcMesh->mNumFaces = 1;
  puVar1 = (undefined8 *)operator_new__(0x18);
  *puVar1 = 1;
  local_58 = (aiFace *)(puVar1 + 1);
  do {
    aiFace::aiFace(local_58);
    local_58 = local_58 + 1;
  } while (local_58 != (aiFace *)(puVar1 + 3));
  this->pcMesh->mFaces = (aiFace *)(puVar1 + 1);
  this->pcMesh->mFaces->mNumIndices = 3;
  puVar2 = (uint *)operator_new__(0xc);
  this->pcMesh->mFaces->mIndices = puVar2;
  *this->pcMesh->mFaces->mIndices = 0;
  this->pcMesh->mFaces->mIndices[1] = 1;
  this->pcMesh->mFaces->mIndices[2] = 1;
  this->pcMesh->mNumVertices = 3;
  paVar3 = (aiVector3D *)operator_new__(0x24);
  local_80 = paVar3;
  do {
    aiVector3t<float>::aiVector3t(local_80);
    local_80 = local_80 + 1;
  } while (local_80 != paVar3 + 3);
  this->pcMesh->mVertices = paVar3;
  aiVector3t<float>::aiVector3t(local_28,0.0,1.0,6.0);
  paVar3 = this->pcMesh->mVertices;
  paVar3->x = local_28[0].x;
  paVar3->y = local_28[0].y;
  paVar3->z = local_28[0].z;
  aiVector3t<float>::aiVector3t(&local_34,2.0,3.0,1.0);
  paVar3 = this->pcMesh->mVertices;
  paVar3[1].x = local_34.x;
  paVar3[1].y = local_34.y;
  paVar3[1].z = local_34.z;
  aiVector3t<float>::aiVector3t(&local_40,3.0,2.0,4.0);
  paVar3 = this->pcMesh->mVertices;
  paVar3[2].x = local_40.x;
  paVar3[2].y = local_40.y;
  paVar3[2].z = local_40.z;
  return;
}

Assistant:

void GenNormalsTest::SetUp()
{
    piProcess = new GenVertexNormalsProcess();
    pcMesh = new aiMesh();
    pcMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;
    pcMesh->mNumFaces = 1;
    pcMesh->mFaces = new aiFace[1];
    pcMesh->mFaces[0].mIndices = new unsigned int[pcMesh->mFaces[0].mNumIndices = 3];
    pcMesh->mFaces[0].mIndices[0] = 0;
    pcMesh->mFaces[0].mIndices[1] = 1;
    pcMesh->mFaces[0].mIndices[2] = 1;
    pcMesh->mNumVertices = 3;
    pcMesh->mVertices = new aiVector3D[3];
    pcMesh->mVertices[0] = aiVector3D(0.0f,1.0f,6.0f);
    pcMesh->mVertices[1] = aiVector3D(2.0f,3.0f,1.0f);
    pcMesh->mVertices[2] = aiVector3D(3.0f,2.0f,4.0f);
}